

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

LBBox3fa * __thiscall
embree::avx::PointsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,PointsISA *this,LinearSpace3fa *space,size_t primID,
          BBox1f *time_range)

{
  float fVar1;
  float fVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  size_t *psVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar39;
  float fVar42;
  float fVar43;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  fVar1 = (this->super_Points).super_Geometry.fnumTimeSegments;
  fVar31 = (this->super_Points).super_Geometry.time_range.lower;
  fVar28 = (this->super_Points).super_Geometry.time_range.upper - fVar31;
  fVar24 = (time_range->lower - fVar31) / fVar28;
  fVar28 = (time_range->upper - fVar31) / fVar28;
  fVar31 = fVar1 * fVar24;
  fVar36 = fVar1 * fVar28;
  auVar29 = vroundss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31),9);
  auVar41 = vroundss_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),10);
  auVar32 = ZEXT816(0) << 0x40;
  auVar25 = vmaxss_avx(auVar29,auVar32);
  auVar40 = vminss_avx(auVar41,ZEXT416((uint)fVar1));
  fVar37 = auVar25._0_4_;
  fVar38 = auVar40._0_4_;
  iVar19 = -1;
  if (-1 < (int)auVar29._0_4_) {
    iVar19 = (int)auVar29._0_4_;
  }
  uVar5 = (int)fVar1 + 1U;
  if ((int)auVar41._0_4_ < (int)((int)fVar1 + 1U)) {
    uVar5 = (int)auVar41._0_4_;
  }
  lVar21 = (long)(int)fVar37;
  pBVar3 = (this->super_Points).vertices.items;
  pcVar4 = pBVar3[lVar21].super_RawBufferView.ptr_ofs;
  lVar23 = pBVar3[lVar21].super_RawBufferView.stride * primID;
  fVar39 = *(float *)(pcVar4 + lVar23);
  fVar2 = *(float *)(pcVar4 + lVar23 + 4);
  fVar42 = *(float *)(pcVar4 + lVar23 + 8);
  fVar6 = (space->vx).field_0.m128[0];
  fVar7 = (space->vx).field_0.m128[1];
  fVar8 = (space->vx).field_0.m128[2];
  fVar9 = (space->vx).field_0.m128[3];
  fVar10 = (space->vy).field_0.m128[0];
  fVar11 = (space->vy).field_0.m128[1];
  fVar12 = (space->vy).field_0.m128[2];
  fVar13 = (space->vy).field_0.m128[3];
  fVar14 = (space->vz).field_0.m128[0];
  fVar15 = (space->vz).field_0.m128[1];
  fVar16 = (space->vz).field_0.m128[2];
  fVar17 = (space->vz).field_0.m128[3];
  auVar25._0_4_ = fVar42 * fVar14 + fVar2 * fVar10 + fVar39 * fVar6;
  auVar25._4_4_ = fVar42 * fVar15 + fVar2 * fVar11 + fVar39 * fVar7;
  auVar25._8_4_ = fVar42 * fVar16 + fVar2 * fVar12 + fVar39 * fVar8;
  auVar25._12_4_ = fVar42 * fVar17 + fVar2 * fVar13 + fVar39 * fVar9;
  fVar39 = *(float *)(pcVar4 + lVar23 + 0xc);
  auVar40._4_4_ = fVar39;
  auVar40._0_4_ = fVar39;
  auVar40._8_4_ = fVar39;
  auVar40._12_4_ = fVar39;
  auVar25 = vblendps_avx(auVar25,auVar40,8);
  fVar2 = (this->super_Points).maxRadiusScale;
  auVar40 = vshufps_avx(ZEXT416((uint)(fVar39 * fVar2)),ZEXT416((uint)(fVar39 * fVar2)),0);
  auVar29 = vsubps_avx(auVar25,auVar40);
  fVar53 = auVar25._0_4_ + auVar40._0_4_;
  fVar56 = auVar25._4_4_ + auVar40._4_4_;
  fVar57 = auVar25._8_4_ + auVar40._8_4_;
  fVar58 = auVar25._12_4_ + auVar40._12_4_;
  lVar23 = (long)(int)fVar38;
  pcVar4 = pBVar3[lVar23].super_RawBufferView.ptr_ofs;
  lVar22 = pBVar3[lVar23].super_RawBufferView.stride * primID;
  fVar39 = *(float *)(pcVar4 + lVar22 + 4);
  fVar42 = *(float *)(pcVar4 + lVar22 + 8);
  fVar43 = *(float *)(pcVar4 + lVar22);
  auVar41._0_4_ = fVar43 * fVar6 + fVar42 * fVar14 + fVar39 * fVar10;
  auVar41._4_4_ = fVar43 * fVar7 + fVar42 * fVar15 + fVar39 * fVar11;
  auVar41._8_4_ = fVar43 * fVar8 + fVar42 * fVar16 + fVar39 * fVar12;
  auVar41._12_4_ = fVar43 * fVar9 + fVar42 * fVar17 + fVar39 * fVar13;
  fVar39 = *(float *)(pcVar4 + lVar22 + 0xc);
  auVar49._4_4_ = fVar39;
  auVar49._0_4_ = fVar39;
  auVar49._8_4_ = fVar39;
  auVar49._12_4_ = fVar39;
  auVar25 = vblendps_avx(auVar41,auVar49,8);
  auVar40 = vshufps_avx(ZEXT416((uint)(fVar39 * fVar2)),ZEXT416((uint)(fVar39 * fVar2)),0);
  auVar41 = vsubps_avx(auVar25,auVar40);
  fVar59 = auVar40._0_4_ + auVar25._0_4_;
  fVar60 = auVar40._4_4_ + auVar25._4_4_;
  fVar61 = auVar40._8_4_ + auVar25._8_4_;
  fVar62 = auVar40._12_4_ + auVar25._12_4_;
  fVar39 = auVar41._0_4_;
  fVar42 = auVar41._4_4_;
  fVar43 = auVar41._8_4_;
  fVar44 = auVar41._12_4_;
  local_38 = auVar29._0_4_;
  fStack_34 = auVar29._4_4_;
  fStack_30 = auVar29._8_4_;
  fStack_2c = auVar29._12_4_;
  if (uVar5 - iVar19 == 1) {
    auVar25 = vmaxss_avx(ZEXT416((uint)(fVar31 - fVar37)),auVar32);
    auVar40 = vshufps_avx(auVar25,auVar25,0);
    auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
    auVar25 = vshufps_avx(auVar25,auVar25,0);
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] =
         auVar25._0_4_ * local_38 + fVar39 * auVar40._0_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] =
         auVar25._4_4_ * fStack_34 + fVar42 * auVar40._4_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] =
         auVar25._8_4_ * fStack_30 + fVar43 * auVar40._8_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] =
         auVar25._12_4_ * fStack_2c + fVar44 * auVar40._12_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] =
         fVar53 * auVar25._0_4_ + fVar59 * auVar40._0_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] =
         fVar56 * auVar25._4_4_ + fVar60 * auVar40._4_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] =
         fVar57 * auVar25._8_4_ + fVar61 * auVar40._8_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] =
         fVar58 * auVar25._12_4_ + fVar62 * auVar40._12_4_;
    auVar25 = vmaxss_avx(ZEXT416((uint)(fVar38 - fVar36)),auVar32);
    auVar40 = vshufps_avx(auVar25,auVar25,0);
    auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
    auVar25 = vshufps_avx(auVar25,auVar25,0);
    fVar31 = auVar40._0_4_ * local_38 + fVar39 * auVar25._0_4_;
    fVar36 = auVar40._4_4_ * fStack_34 + fVar42 * auVar25._4_4_;
    fVar37 = auVar40._8_4_ * fStack_30 + fVar43 * auVar25._8_4_;
    fVar38 = auVar40._12_4_ * fStack_2c + fVar44 * auVar25._12_4_;
    fVar39 = fVar53 * auVar40._0_4_ + fVar59 * auVar25._0_4_;
    fVar42 = fVar56 * auVar40._4_4_ + fVar60 * auVar25._4_4_;
    fVar43 = fVar57 * auVar40._8_4_ + fVar61 * auVar25._8_4_;
    fVar44 = fVar58 * auVar40._12_4_ + fVar62 * auVar25._12_4_;
  }
  else {
    pcVar4 = pBVar3[lVar21 + 1].super_RawBufferView.ptr_ofs;
    lVar21 = pBVar3[lVar21 + 1].super_RawBufferView.stride * primID;
    fVar45 = *(float *)(pcVar4 + lVar21);
    fVar46 = *(float *)(pcVar4 + lVar21 + 4);
    fVar47 = *(float *)(pcVar4 + lVar21 + 8);
    auVar29._0_4_ = fVar45 * fVar6 + fVar14 * fVar47 + fVar10 * fVar46;
    auVar29._4_4_ = fVar45 * fVar7 + fVar15 * fVar47 + fVar11 * fVar46;
    auVar29._8_4_ = fVar45 * fVar8 + fVar16 * fVar47 + fVar12 * fVar46;
    auVar29._12_4_ = fVar45 * fVar9 + fVar17 * fVar47 + fVar13 * fVar46;
    fVar45 = *(float *)(pcVar4 + lVar21 + 0xc);
    auVar32._4_4_ = fVar45;
    auVar32._0_4_ = fVar45;
    auVar32._8_4_ = fVar45;
    auVar32._12_4_ = fVar45;
    auVar25 = vblendps_avx(auVar29,auVar32,8);
    auVar33._0_4_ = fVar2 * fVar45;
    auVar33._4_4_ = fVar2 * fVar45;
    auVar33._8_4_ = fVar2 * fVar45;
    auVar33._12_4_ = fVar2 * fVar45;
    auVar32 = vsubps_avx(auVar25,auVar33);
    pcVar4 = pBVar3[lVar23 + -1].super_RawBufferView.ptr_ofs;
    lVar23 = pBVar3[lVar23 + -1].super_RawBufferView.stride * primID;
    fVar45 = *(float *)(pcVar4 + lVar23);
    fVar46 = *(float *)(pcVar4 + lVar23 + 4);
    fVar47 = *(float *)(pcVar4 + lVar23 + 8);
    auVar30._0_4_ = fVar6 * fVar45 + fVar46 * fVar10 + fVar14 * fVar47;
    auVar30._4_4_ = fVar7 * fVar45 + fVar46 * fVar11 + fVar15 * fVar47;
    auVar30._8_4_ = fVar8 * fVar45 + fVar46 * fVar12 + fVar16 * fVar47;
    auVar30._12_4_ = fVar9 * fVar45 + fVar46 * fVar13 + fVar17 * fVar47;
    fVar45 = *(float *)(pcVar4 + lVar23 + 0xc);
    auVar34._4_4_ = fVar45;
    auVar34._0_4_ = fVar45;
    auVar34._8_4_ = fVar45;
    auVar34._12_4_ = fVar45;
    auVar40 = vblendps_avx(auVar30,auVar34,8);
    auVar35._0_4_ = fVar2 * fVar45;
    auVar35._4_4_ = fVar2 * fVar45;
    auVar35._8_4_ = fVar2 * fVar45;
    auVar35._12_4_ = fVar2 * fVar45;
    auVar49 = vsubps_avx(auVar40,auVar35);
    auVar29 = vmaxss_avx(ZEXT416((uint)(fVar31 - fVar37)),ZEXT416(0));
    auVar41 = vshufps_avx(auVar29,auVar29,0);
    auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
    auVar29 = vshufps_avx(auVar29,auVar29,0);
    fVar45 = auVar29._0_4_ * local_38 + auVar32._0_4_ * auVar41._0_4_;
    fVar46 = auVar29._4_4_ * fStack_34 + auVar32._4_4_ * auVar41._4_4_;
    fVar47 = auVar29._8_4_ * fStack_30 + auVar32._8_4_ * auVar41._8_4_;
    fVar48 = auVar29._12_4_ * fStack_2c + auVar32._12_4_ * auVar41._12_4_;
    fVar53 = auVar29._0_4_ * fVar53 + auVar41._0_4_ * (auVar33._0_4_ + auVar25._0_4_);
    fVar56 = auVar29._4_4_ * fVar56 + auVar41._4_4_ * (auVar33._4_4_ + auVar25._4_4_);
    fVar57 = auVar29._8_4_ * fVar57 + auVar41._8_4_ * (auVar33._8_4_ + auVar25._8_4_);
    fVar58 = auVar29._12_4_ * fVar58 + auVar41._12_4_ * (auVar33._12_4_ + auVar25._12_4_);
    auVar25 = vmaxss_avx(ZEXT416((uint)(fVar38 - fVar36)),ZEXT416(0));
    auVar29 = vshufps_avx(auVar25,auVar25,0);
    auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
    auVar25 = vshufps_avx(auVar25,auVar25,0);
    fVar31 = auVar25._0_4_ * fVar39 + auVar29._0_4_ * auVar49._0_4_;
    fVar36 = auVar25._4_4_ * fVar42 + auVar29._4_4_ * auVar49._4_4_;
    fVar37 = auVar25._8_4_ * fVar43 + auVar29._8_4_ * auVar49._8_4_;
    fVar38 = auVar25._12_4_ * fVar44 + auVar29._12_4_ * auVar49._12_4_;
    fVar39 = auVar25._0_4_ * fVar59 + auVar29._0_4_ * (auVar35._0_4_ + auVar40._0_4_);
    fVar42 = auVar25._4_4_ * fVar60 + auVar29._4_4_ * (auVar35._4_4_ + auVar40._4_4_);
    fVar43 = auVar25._8_4_ * fVar61 + auVar29._8_4_ * (auVar35._8_4_ + auVar40._8_4_);
    fVar44 = auVar25._12_4_ * fVar62 + auVar29._12_4_ * (auVar35._12_4_ + auVar40._12_4_);
    uVar20 = iVar19 + 1;
    if ((int)uVar20 < (int)uVar5) {
      psVar18 = &pBVar3[uVar20].super_RawBufferView.stride;
      do {
        auVar51._0_4_ = ((float)(int)uVar20 / fVar1 - fVar24) / (fVar28 - fVar24);
        auVar51._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar25 = vshufps_avx(auVar51,auVar51,0);
        auVar40 = vshufps_avx(ZEXT416((uint)(1.0 - auVar51._0_4_)),
                              ZEXT416((uint)(1.0 - auVar51._0_4_)),0);
        auVar50._0_4_ = auVar25._0_4_ * fVar31 + fVar45 * auVar40._0_4_;
        auVar50._4_4_ = auVar25._4_4_ * fVar36 + fVar46 * auVar40._4_4_;
        auVar50._8_4_ = auVar25._8_4_ * fVar37 + fVar47 * auVar40._8_4_;
        auVar50._12_4_ = auVar25._12_4_ * fVar38 + fVar48 * auVar40._12_4_;
        auVar52._0_4_ = fVar39 * auVar25._0_4_ + fVar53 * auVar40._0_4_;
        auVar52._4_4_ = fVar42 * auVar25._4_4_ + fVar56 * auVar40._4_4_;
        auVar52._8_4_ = fVar43 * auVar25._8_4_ + fVar57 * auVar40._8_4_;
        auVar52._12_4_ = fVar44 * auVar25._12_4_ + fVar58 * auVar40._12_4_;
        pcVar4 = ((RawBufferView *)(psVar18 + -2))->ptr_ofs;
        lVar23 = *psVar18 * primID;
        fVar59 = *(float *)(pcVar4 + lVar23);
        fVar60 = *(float *)(pcVar4 + lVar23 + 4);
        fVar61 = *(float *)(pcVar4 + lVar23 + 8);
        auVar26._0_4_ = fVar59 * fVar6 + fVar60 * fVar10 + fVar14 * fVar61;
        auVar26._4_4_ = fVar59 * fVar7 + fVar60 * fVar11 + fVar15 * fVar61;
        auVar26._8_4_ = fVar59 * fVar8 + fVar60 * fVar12 + fVar16 * fVar61;
        auVar26._12_4_ = fVar59 * fVar9 + fVar60 * fVar13 + fVar17 * fVar61;
        fVar59 = *(float *)(pcVar4 + lVar23 + 0xc);
        auVar54._4_4_ = fVar59;
        auVar54._0_4_ = fVar59;
        auVar54._8_4_ = fVar59;
        auVar54._12_4_ = fVar59;
        auVar25 = vblendps_avx(auVar26,auVar54,8);
        auVar55._0_4_ = fVar59 * fVar2;
        auVar55._4_4_ = fVar59 * fVar2;
        auVar55._8_4_ = fVar59 * fVar2;
        auVar55._12_4_ = fVar59 * fVar2;
        auVar40 = vsubps_avx(auVar25,auVar55);
        auVar40 = vsubps_avx(auVar40,auVar50);
        auVar27._0_4_ = auVar55._0_4_ + auVar25._0_4_;
        auVar27._4_4_ = auVar55._4_4_ + auVar25._4_4_;
        auVar27._8_4_ = auVar55._8_4_ + auVar25._8_4_;
        auVar27._12_4_ = auVar55._12_4_ + auVar25._12_4_;
        auVar29 = vsubps_avx(auVar27,auVar52);
        auVar25 = vminps_avx(auVar40,ZEXT416(0) << 0x20);
        fVar45 = fVar45 + auVar25._0_4_;
        fVar46 = fVar46 + auVar25._4_4_;
        fVar47 = fVar47 + auVar25._8_4_;
        fVar48 = fVar48 + auVar25._12_4_;
        fVar31 = auVar25._0_4_ + fVar31;
        fVar36 = auVar25._4_4_ + fVar36;
        fVar37 = auVar25._8_4_ + fVar37;
        fVar38 = auVar25._12_4_ + fVar38;
        auVar25 = vmaxps_avx(auVar29,ZEXT416(0) << 0x20);
        fVar53 = fVar53 + auVar25._0_4_;
        fVar56 = fVar56 + auVar25._4_4_;
        fVar57 = fVar57 + auVar25._8_4_;
        fVar58 = fVar58 + auVar25._12_4_;
        fVar39 = fVar39 + auVar25._0_4_;
        fVar42 = fVar42 + auVar25._4_4_;
        fVar43 = fVar43 + auVar25._8_4_;
        fVar44 = fVar44 + auVar25._12_4_;
        uVar20 = uVar20 + 1;
        psVar18 = psVar18 + 7;
      } while (uVar5 != uVar20);
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar45;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar46;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar47;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar48;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar53;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar56;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar57;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar58;
  }
  (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar31;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar36;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar37;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar38;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar39;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar42;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar43;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar44;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(const LinearSpace3fa& space, size_t primID, const BBox1f& time_range) const
      {
        return linearBounds(space, primID, time_range);
      }